

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::NFRule::doParse
          (NFRule *this,UnicodeString *text,ParsePosition *parsePosition,UBool isFractionRule,
          double upperBound,uint32_t nonNumericalExecutedRuleMask,Formattable *resVal)

{
  short sVar1;
  long lVar2;
  int32_t iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined7 in_register_00000009;
  int srcStart;
  int32_t srcLength;
  int32_t startPos;
  double dVar8;
  ParsePosition pp;
  ParsePosition pp2;
  UnicodeString workText;
  UnicodeString workText2;
  UnicodeString temp;
  UnicodeString prefix;
  int local_1a8;
  ParsePosition local_198;
  double local_188;
  uint32_t local_17c;
  undefined4 local_178;
  int32_t local_174;
  ParsePosition local_170;
  double local_160;
  double local_158;
  UnicodeString *local_150;
  Formattable *local_148;
  double local_140;
  _func_int **local_138;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_138 = (_func_int **)&PTR__ParsePosition_003a03b0;
  local_198.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003a03b0;
  local_198.index = 0;
  local_198.errorIndex = -1;
  local_17c = nonNumericalExecutedRuleMask;
  local_158 = upperBound;
  UnicodeString::UnicodeString(&local_130,text);
  if (this->sub1 == (NFSubstitution *)0x0) {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcLength = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      srcLength = (int)sVar1 >> 5;
    }
  }
  else {
    srcLength = this->sub1->pos;
  }
  local_178 = (undefined4)CONCAT71(in_register_00000009,isFractionRule);
  if (this->sub2 == (NFSubstitution *)0x0) {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcStart = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      srcStart = (int)sVar1 >> 5;
    }
  }
  else {
    srcStart = this->sub2->pos;
  }
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_150 = &this->fRuleText;
  UnicodeString::setTo(&local_70,local_150,0,srcLength);
  stripPrefix(this,&local_130,&local_70,&local_198);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  uVar5 = local_130.fUnion.fFields.fLength;
  if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
    uVar5 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (srcLength == 0 || local_198.index != 0) {
    lVar2 = this->baseValue;
    if (lVar2 == -6) {
      parsePosition->index = local_198.index;
      dVar8 = uprv_getNaN_63();
    }
    else {
      if (lVar2 != -5) {
        local_188 = 0.0;
        local_160 = 0.0;
        if (0 < lVar2) {
          local_160 = (double)lVar2;
        }
        local_b0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003a7268;
        local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
        local_174 = srcStart - srcLength;
        local_1a8 = 0;
        startPos = 0;
        local_148 = resVal;
        while( true ) {
          local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
          UnicodeString::setTo(&local_b0,local_150,srcLength,local_174);
          dVar8 = matchToDelimiter(this,&local_130,startPos,local_160,&local_b0,&local_198,
                                   this->sub1,local_17c,local_158);
          iVar3 = local_198.index;
          if ((local_198.index == 0) && (this->sub1 != (NFSubstitution *)0x0)) {
            if (parsePosition->errorIndex < local_198.errorIndex + srcLength) {
              parsePosition->errorIndex = local_198.errorIndex + srcLength;
            }
          }
          else {
            local_f0.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)&PTR__UnicodeString_003a7268;
            local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
            uVar7 = local_130.fUnion.fFields.fLength;
            if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
              uVar7 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            local_140 = dVar8;
            UnicodeString::setTo(&local_f0,&local_130,local_198.index,uVar7 - local_198.index);
            local_170.super_UObject._vptr_UObject = local_138;
            local_170.index = 0;
            local_170.errorIndex = -1;
            sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar6 = (this->fRuleText).fUnion.fFields.fLength;
            }
            else {
              iVar6 = (int)sVar1 >> 5;
            }
            UnicodeString::setTo(&local_b0,local_150,srcStart,iVar6 - srcStart);
            dVar8 = matchToDelimiter(this,&local_f0,0,local_140,&local_b0,&local_170,this->sub2,
                                     local_17c,local_158);
            if ((local_170.index == 0) && (this->sub2 != (NFSubstitution *)0x0)) {
              iVar6 = local_170.errorIndex + srcLength + local_198.index;
              if (parsePosition->errorIndex < iVar6) {
                parsePosition->errorIndex = iVar6;
              }
            }
            else {
              iVar6 = local_170.index + (iVar4 - uVar5) + local_198.index;
              if (local_1a8 < iVar6) {
                local_1a8 = iVar6;
                local_188 = dVar8;
              }
            }
            ParsePosition::~ParsePosition(&local_170);
            UnicodeString::~UnicodeString(&local_f0);
            startPos = iVar3;
          }
          if ((srcStart == srcLength) || (local_198.index < 1)) break;
          uVar7 = local_130.fUnion.fFields.fLength;
          if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
            uVar7 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (((int)uVar7 <= local_198.index) || (local_198.index == startPos)) break;
        }
        parsePosition->index = local_1a8;
        if (0 < local_1a8) {
          parsePosition->errorIndex = 0;
        }
        dVar8 = local_188;
        if (this->sub1 == (NFSubstitution *)0x0) {
          dVar8 = 1.0 / local_188;
        }
        if (local_1a8 < 1) {
          dVar8 = local_188;
        }
        if ((char)local_178 == '\0') {
          dVar8 = local_188;
        }
        Formattable::setDouble(local_148,dVar8);
        UnicodeString::~UnicodeString(&local_b0);
        goto LAB_00249c21;
      }
      parsePosition->index = local_198.index;
      dVar8 = uprv_getInfinity_63();
    }
    Formattable::setDouble(resVal,dVar8);
  }
  else {
    parsePosition->errorIndex = local_198.errorIndex;
    Formattable::setLong(resVal,0);
  }
LAB_00249c21:
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString(&local_130);
  ParsePosition::~ParsePosition(&local_198);
  return '\x01';
}

Assistant:

UBool
NFRule::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                UBool isFractionRule,
                double upperBound,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // internally we operate on a copy of the string being parsed
    // (because we're going to change it) and use our own ParsePosition
    ParsePosition pp;
    UnicodeString workText(text);

    int32_t sub1Pos = sub1 != NULL ? sub1->getPos() : fRuleText.length();
    int32_t sub2Pos = sub2 != NULL ? sub2->getPos() : fRuleText.length();

    // check to see whether the text before the first substitution
    // matches the text at the beginning of the string being
    // parsed.  If it does, strip that off the front of workText;
    // otherwise, dump out with a mismatch
    UnicodeString prefix;
    prefix.setTo(fRuleText, 0, sub1Pos);

#ifdef RBNF_DEBUG
    fprintf(stderr, "doParse %p ", this);
    {
        UnicodeString rt;
        _appendRuleText(rt);
        dumpUS(stderr, rt);
    }

    fprintf(stderr, " text: '");
    dumpUS(stderr, text);
    fprintf(stderr, "' prefix: '");
    dumpUS(stderr, prefix);
#endif
    stripPrefix(workText, prefix, pp);
    int32_t prefixLength = text.length() - workText.length();

#ifdef RBNF_DEBUG
    fprintf(stderr, "' pl: %d ppi: %d s1p: %d\n", prefixLength, pp.getIndex(), sub1Pos);
#endif

    if (pp.getIndex() == 0 && sub1Pos != 0) {
        // commented out because ParsePosition doesn't have error index in 1.1.x
        // restored for ICU4C port
        parsePosition.setErrorIndex(pp.getErrorIndex());
        resVal.setLong(0);
        return TRUE;
    }
    if (baseValue == kInfinityRule) {
        // If you match this, don't try to perform any calculations on it.
        parsePosition.setIndex(pp.getIndex());
        resVal.setDouble(uprv_getInfinity());
        return TRUE;
    }
    if (baseValue == kNaNRule) {
        // If you match this, don't try to perform any calculations on it.
        parsePosition.setIndex(pp.getIndex());
        resVal.setDouble(uprv_getNaN());
        return TRUE;
    }

    // this is the fun part.  The basic guts of the rule-matching
    // logic is matchToDelimiter(), which is called twice.  The first
    // time it searches the input string for the rule text BETWEEN
    // the substitutions and tries to match the intervening text
    // in the input string with the first substitution.  If that
    // succeeds, it then calls it again, this time to look for the
    // rule text after the second substitution and to match the
    // intervening input text against the second substitution.
    //
    // For example, say we have a rule that looks like this:
    //    first << middle >> last;
    // and input text that looks like this:
    //    first one middle two last
    // First we use stripPrefix() to match "first " in both places and
    // strip it off the front, leaving
    //    one middle two last
    // Then we use matchToDelimiter() to match " middle " and try to
    // match "one" against a substitution.  If it's successful, we now
    // have
    //    two last
    // We use matchToDelimiter() a second time to match " last" and
    // try to match "two" against a substitution.  If "two" matches
    // the substitution, we have a successful parse.
    //
    // Since it's possible in many cases to find multiple instances
    // of each of these pieces of rule text in the input string,
    // we need to try all the possible combinations of these
    // locations.  This prevents us from prematurely declaring a mismatch,
    // and makes sure we match as much input text as we can.
    int highWaterMark = 0;
    double result = 0;
    int start = 0;
    double tempBaseValue = (double)(baseValue <= 0 ? 0 : baseValue);

    UnicodeString temp;
    do {
        // our partial parse result starts out as this rule's base
        // value.  If it finds a successful match, matchToDelimiter()
        // will compose this in some way with what it gets back from
        // the substitution, giving us a new partial parse result
        pp.setIndex(0);

        temp.setTo(fRuleText, sub1Pos, sub2Pos - sub1Pos);
        double partialResult = matchToDelimiter(workText, start, tempBaseValue,
            temp, pp, sub1,
            nonNumericalExecutedRuleMask,
            upperBound);

        // if we got a successful match (or were trying to match a
        // null substitution), pp is now pointing at the first unmatched
        // character.  Take note of that, and try matchToDelimiter()
        // on the input text again
        if (pp.getIndex() != 0 || sub1 == NULL) {
            start = pp.getIndex();

            UnicodeString workText2;
            workText2.setTo(workText, pp.getIndex(), workText.length() - pp.getIndex());
            ParsePosition pp2;

            // the second matchToDelimiter() will compose our previous
            // partial result with whatever it gets back from its
            // substitution if there's a successful match, giving us
            // a real result
            temp.setTo(fRuleText, sub2Pos, fRuleText.length() - sub2Pos);
            partialResult = matchToDelimiter(workText2, 0, partialResult,
                temp, pp2, sub2,
                nonNumericalExecutedRuleMask,
                upperBound);

            // if we got a successful match on this second
            // matchToDelimiter() call, update the high-water mark
            // and result (if necessary)
            if (pp2.getIndex() != 0 || sub2 == NULL) {
                if (prefixLength + pp.getIndex() + pp2.getIndex() > highWaterMark) {
                    highWaterMark = prefixLength + pp.getIndex() + pp2.getIndex();
                    result = partialResult;
                }
            }
            else {
                // commented out because ParsePosition doesn't have error index in 1.1.x
                // restored for ICU4C port
                int32_t i_temp = pp2.getErrorIndex() + sub1Pos + pp.getIndex();
                if (i_temp> parsePosition.getErrorIndex()) {
                    parsePosition.setErrorIndex(i_temp);
                }
            }
        }
        else {
            // commented out because ParsePosition doesn't have error index in 1.1.x
            // restored for ICU4C port
            int32_t i_temp = sub1Pos + pp.getErrorIndex();
            if (i_temp > parsePosition.getErrorIndex()) {
                parsePosition.setErrorIndex(i_temp);
            }
        }
        // keep trying to match things until the outer matchToDelimiter()
        // call fails to make a match (each time, it picks up where it
        // left off the previous time)
    } while (sub1Pos != sub2Pos
        && pp.getIndex() > 0
        && pp.getIndex() < workText.length()
        && pp.getIndex() != start);

    // update the caller's ParsePosition with our high-water mark
    // (i.e., it now points at the first character this function
    // didn't match-- the ParsePosition is therefore unchanged if
    // we didn't match anything)
    parsePosition.setIndex(highWaterMark);
    // commented out because ParsePosition doesn't have error index in 1.1.x
    // restored for ICU4C port
    if (highWaterMark > 0) {
        parsePosition.setErrorIndex(0);
    }

    // this is a hack for one unusual condition: Normally, whether this
    // rule belong to a fraction rule set or not is handled by its
    // substitutions.  But if that rule HAS NO substitutions, then
    // we have to account for it here.  By definition, if the matching
    // rule in a fraction rule set has no substitutions, its numerator
    // is 1, and so the result is the reciprocal of its base value.
    if (isFractionRule && highWaterMark > 0 && sub1 == NULL) {
        result = 1 / result;
    }

    resVal.setDouble(result);
    return TRUE; // ??? do we need to worry if it is a long or a double?
}